

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::TestSuite::successful_test_count(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  pointer ppTVar3;
  
  ppTVar3 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar3 ==
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      bVar1 = TestPassed(*ppTVar3);
      iVar2 = iVar2 + (uint)bVar1;
      ppTVar3 = ppTVar3 + 1;
    } while (ppTVar3 !=
             (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return iVar2;
}

Assistant:

int TestSuite::successful_test_count() const {
  return CountIf(test_info_list_, TestPassed);
}